

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddQuadFilled(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col)

{
  ImU32 col_local;
  ImVec2 *d_local;
  ImVec2 *c_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  if (col >> 0x18 != 0) {
    PathLineTo(this,a);
    PathLineTo(this,b);
    PathLineTo(this,c);
    PathLineTo(this,d);
    PathFill(this,col);
  }
  return;
}

Assistant:

void ImDrawList::AddQuadFilled(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathFill(col);
}